

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

String * Rml::StringUtilities::DecodeRml(String *__return_storage_ptr__,String *s)

{
  ulong uVar1;
  char *pcVar2;
  Character character;
  Character character_00;
  String local_118;
  ulong local_f8;
  unsigned_long code_point_1;
  char *end_1;
  char *begin_1;
  String tmp_1;
  value_type *c_1;
  size_t j_1;
  String local_a8;
  ulong local_88;
  unsigned_long code_point;
  char *end;
  char *begin;
  String tmp;
  value_type *c;
  size_t j;
  size_t start;
  size_t i;
  String *s_local;
  String *result;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  start = 0;
LAB_0061515f:
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          uVar1 = ::std::__cxx11::string::size();
          if (uVar1 <= start) {
            return __return_storage_ptr__;
          }
          pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s);
          if (*pcVar2 != '&') goto LAB_00615791;
          pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s);
          if (((*pcVar2 != 'l') ||
              (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != 't')) ||
             (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != ';')) break;
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"<");
          start = start + 4;
        }
        pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s);
        if (((*pcVar2 != 'g') ||
            (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != 't')) ||
           (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != ';')) break;
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">");
        start = start + 4;
      }
      pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s);
      if (((*pcVar2 != 'a') ||
          (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != 'm')) ||
         ((pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != 'p' ||
          (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != ';')))) break;
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&");
      start = start + 5;
    }
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s);
    if ((((*pcVar2 != 'q') ||
         (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != 'u')) ||
        (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != 'o')) ||
       ((pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != 't' ||
        (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != ';')))) break;
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    start = start + 6;
  }
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s);
  if (*pcVar2 != '#') goto LAB_00615791;
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s);
  if (*pcVar2 == 'x') {
    c = (value_type *)0x0;
    while ((c < (value_type *)0x8 &&
           (((tmp.field_2._8_8_ = ::std::__cxx11::string::operator[]((ulong)s),
             '/' < *(char *)tmp.field_2._8_8_ && (*(char *)tmp.field_2._8_8_ < ':')) ||
            ((('`' < *(char *)tmp.field_2._8_8_ && (*(char *)tmp.field_2._8_8_ < 'g')) ||
             (('@' < *(char *)tmp.field_2._8_8_ && (*(char *)tmp.field_2._8_8_ < 'G'))))))))) {
      c = c + 1;
    }
    if ((c == (value_type *)0x0) ||
       (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 != ';'))
    goto LAB_00615791;
    ::std::__cxx11::string::substr((ulong)&begin,(ulong)s);
    end = (char *)::std::__cxx11::string::c_str();
    local_88 = strtoul(end,(char **)&code_point,0x10);
    if ((local_88 == 0) || (local_88 == 0xffffffffffffffff)) {
      j_1._4_4_ = 0;
    }
    else {
      ToUTF8_abi_cxx11_(&local_a8,(StringUtilities *)(local_88 & 0xffffffff),character);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      start = start + (code_point - (long)end) + 4;
      j_1._4_4_ = 3;
    }
    ::std::__cxx11::string::~string((string *)&begin);
    if (j_1._4_4_ != 0) goto LAB_0061515f;
  }
  else {
    c_1 = (value_type *)0x0;
    while (((c_1 < (value_type *)0x8 &&
            (tmp_1.field_2._8_8_ = ::std::__cxx11::string::operator[]((ulong)s),
            '/' < *(char *)tmp_1.field_2._8_8_)) && (*(char *)tmp_1.field_2._8_8_ < ':'))) {
      c_1 = c_1 + 1;
    }
    if ((c_1 != (value_type *)0x0) &&
       (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s), *pcVar2 == ';')) {
      ::std::__cxx11::string::substr((ulong)&begin_1,(ulong)s);
      end_1 = (char *)::std::__cxx11::string::c_str();
      local_f8 = strtoul(end_1,(char **)&code_point_1,10);
      if ((local_f8 == 0) || (local_f8 == 0xffffffffffffffff)) {
        j_1._4_4_ = 0;
      }
      else {
        ToUTF8_abi_cxx11_(&local_118,(StringUtilities *)(local_f8 & 0xffffffff),character_00);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
        ::std::__cxx11::string::~string((string *)&local_118);
        start = start + (code_point_1 - (long)end_1) + 3;
        j_1._4_4_ = 3;
      }
      ::std::__cxx11::string::~string((string *)&begin_1);
      if (j_1._4_4_ == 0) goto LAB_00615791;
      goto LAB_0061515f;
    }
  }
LAB_00615791:
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)s);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
  start = start + 1;
  goto LAB_0061515f;
}

Assistant:

String StringUtilities::DecodeRml(const String& s)
{
	String result;
	result.reserve(s.size());
	for (size_t i = 0; i < s.size();)
	{
		if (s[i] == '&')
		{
			if (s[i + 1] == 'l' && s[i + 2] == 't' && s[i + 3] == ';')
			{
				result += "<";
				i += 4;
				continue;
			}
			else if (s[i + 1] == 'g' && s[i + 2] == 't' && s[i + 3] == ';')
			{
				result += ">";
				i += 4;
				continue;
			}
			else if (s[i + 1] == 'a' && s[i + 2] == 'm' && s[i + 3] == 'p' && s[i + 4] == ';')
			{
				result += "&";
				i += 5;
				continue;
			}
			else if (s[i + 1] == 'q' && s[i + 2] == 'u' && s[i + 3] == 'o' && s[i + 4] == 't' && s[i + 5] == ';')
			{
				result += "\"";
				i += 6;
				continue;
			}
			else if (s[i + 1] == '#')
			{
				size_t start = i + 2;
				if (s[i + 2] == 'x')
				{
					start++;
					size_t j = 0;
					for (; j < 8; j++)
					{
						const auto& c = s[start + j];
						if (!((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')))
							break;
					}

					if (j > 0 && s[start + j] == ';')
					{
						String tmp = s.substr(start, j);
						const char* begin = tmp.c_str();
						char* end;
						unsigned long code_point = strtoul(begin, &end, 16);
						if (code_point != 0 && code_point != ULONG_MAX)
						{
							result += ToUTF8(static_cast<Character>(code_point));
							i = start + (end - begin) + 1;
							continue;
						}
					}
				}
				else
				{
					size_t j = 0;
					for (; j < 8; j++)
					{
						const auto& c = s[start + j];
						if (!(c >= '0' && c <= '9'))
							break;
					}

					if (j > 0 && s[start + j] == ';')
					{
						String tmp = s.substr(start, j);
						const char* begin = tmp.c_str();
						char* end;
						unsigned long code_point = strtoul(begin, &end, 10);
						if (code_point != 0 && code_point != ULONG_MAX)
						{
							result += ToUTF8(static_cast<Character>(code_point));
							i = start + (end - begin) + 1;
							continue;
						}
					}
				}
			}
		}
		result += s[i];
		i += 1;
	}
	return result;
}